

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_privkey.c
# Opt level: O1

err_t cmdPrivkeyWrite(octet *privkey,size_t privkey_len,char *name,cmd_pwd_t pwd)

{
  err_t eVar1;
  octet *salt;
  size_t pwd_len;
  size_t epki_len;
  octet *local_38;
  
  eVar1 = bpkiPrivkeyWrap((octet *)0x0,&epki_len,(octet *)0x0,privkey_len,(octet *)0x0,0,
                          (octet *)0x0,10000);
  if (eVar1 == 0) {
    salt = (octet *)blobCreate(epki_len + 8);
    if (salt == (octet *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      eVar1 = cmdRngStart(1);
      if (eVar1 == 0) {
        rngStepR(salt,8,(void *)0x0);
        pwd_len = strLen(pwd);
        local_38 = salt + 8;
        eVar1 = bpkiPrivkeyWrap(salt + 8,(size_t *)0x0,privkey,privkey_len,(octet *)pwd,pwd_len,salt
                                ,10000);
        if (eVar1 == 0) {
          eVar1 = cmdFileWrite(name,local_38,epki_len);
        }
      }
      blobClose(salt);
    }
  }
  return eVar1;
}

Assistant:

err_t cmdPrivkeyWrite(const octet privkey[], size_t privkey_len,
	const char* name, const cmd_pwd_t pwd)
{
	err_t code;
	const size_t iter = 10000;
	void* stack;
	octet* salt;
	octet* epki;
	size_t epki_len;
	// pre
	ASSERT(privkey_len == 24 || privkey_len == 32 || privkey_len == 48 || 
		privkey_len == 64);
	ASSERT(memIsValid(privkey, privkey_len));
	ASSERT(strIsValid(name));
	ASSERT(cmdPwdIsValid(pwd));
	// определить длину контейнера
	code = bpkiPrivkeyWrap(0, &epki_len, 0, privkey_len, 0, 0, 0, iter);
	ERR_CALL_CHECK(code);
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, 8 + epki_len);
	ERR_CALL_CHECK(code);
	salt = (octet*)stack;
	epki = salt + 8;
	// запустить ГСЧ
	code = cmdRngStart(TRUE);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// установить защиту
	rngStepR(salt, 8, 0);
	code = bpkiPrivkeyWrap(epki, 0, privkey, privkey_len, (const octet*)pwd,
		cmdPwdLen(pwd), salt, iter);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// записать в файл
	code = cmdFileWrite(name, epki, epki_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}